

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  undefined1 local_b8 [8];
  MockNamedValue parameter;
  TypeForTestingExpectedFunctionCall equalType;
  TypeForTestingExpectedFunctionCall type;
  undefined1 local_28 [8];
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator;
  TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test *this_local;
  
  TypeForTestingExpectedFunctionCallComparator::TypeForTestingExpectedFunctionCallComparator
            ((TypeForTestingExpectedFunctionCallComparator *)&repository.head_);
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28);
  SimpleString::SimpleString((SimpleString *)&type.value,"type");
  MockNamedValueComparatorsAndCopiersRepository::installComparator
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28,(SimpleString *)&type.value,
             (MockNamedValueComparator *)&repository.head_);
  SimpleString::~SimpleString((SimpleString *)&type.value);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&equalType.value,1);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&parameter.copier_,1);
  SimpleString::SimpleString(&local_c8,"name");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_b8,&local_c8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::SimpleString(&local_d8,"type");
  MockNamedValue::setConstObjectPointer((MockNamedValue *)local_b8,&local_d8,&parameter.copier_);
  SimpleString::~SimpleString(&local_d8);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_e8,"type");
  SimpleString::SimpleString(&local_f8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar1,&local_e8,&local_f8,&equalType.value);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::~SimpleString(&local_e8);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2b])(pMVar1,local_b8);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 1),"CHECK","call->hasInputParameter(parameter)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x182,pTVar4);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_b8);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&parameter.copier_);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&equalType.value);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28);
  TypeForTestingExpectedFunctionCallComparator::~TypeForTestingExpectedFunctionCallComparator
            ((TypeForTestingExpectedFunctionCallComparator *)&repository.head_);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparison)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);

    call->withParameterOfType("type", "name", &type);
    CHECK(call->hasInputParameter(parameter));
}